

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

SoftmaxParameter * __thiscall caffe::V1LayerParameter::mutable_softmax_param(V1LayerParameter *this)

{
  SoftmaxParameter *this_00;
  V1LayerParameter *this_local;
  
  set_has_softmax_param(this);
  if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
    this_00 = (SoftmaxParameter *)operator_new(0x20);
    SoftmaxParameter::SoftmaxParameter(this_00);
    this->softmax_param_ = this_00;
  }
  return this->softmax_param_;
}

Assistant:

inline ::caffe::SoftmaxParameter* V1LayerParameter::mutable_softmax_param() {
  set_has_softmax_param();
  if (softmax_param_ == NULL) {
    softmax_param_ = new ::caffe::SoftmaxParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V1LayerParameter.softmax_param)
  return softmax_param_;
}